

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,DataRate *datarate)

{
  DataRate DVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  DVar1 = *datarate;
  if (DVar1 == _1M) {
    __s = "1Mbps";
    __a = &local_c;
  }
  else if (DVar1 == _300K) {
    __s = "300Kbps";
    __a = &local_a;
  }
  else if (DVar1 == _500K) {
    __s = "500Kbps";
    __a = &local_b;
  }
  else if (DVar1 == _250K) {
    __s = "250Kbps";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DataRate& datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return "250Kbps";       break;
    case DataRate::_300K:   return "300Kbps";       break;
    case DataRate::_500K:   return "500Kbps";       break;
    case DataRate::_1M:     return "1Mbps";         break;
    case DataRate::Unknown: break;
    }
    return "Unknown";
}